

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::get_scale<0ul>(gd *g,example *param_2,float weight)

{
  float fVar1;
  long in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float t;
  float update_scale;
  
  fVar1 = *(float *)(*(long *)(in_RDI + 0x60) + 0x3560);
  fVar2 = powf((float)((*(double *)(**(long **)(in_RDI + 0x60) + 0x18) + (double)in_XMM0_Da) -
                      *(double *)(**(long **)(in_RDI + 0x60) + 0x78)),*(float *)(in_RDI + 0x20));
  return fVar2 * fVar1 * in_XMM0_Da;
}

Assistant:

float get_scale(gd& g, example& /* ec */, float weight)
{
  float update_scale = g.all->eta * weight;
  if (!adaptive)
  {
    float t = (float)(g.all->sd->t + weight - g.all->sd->weighted_holdout_examples);
    update_scale *= powf(t, g.neg_power_t);
  }
  return update_scale;
}